

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Widget.h
# Opt level: O0

void __thiscall gui::Widget::~Widget(Widget *this)

{
  Drawable *in_RDI;
  
  in_RDI->_vptr_Drawable = (_func_int **)&PTR__Widget_002f6b58;
  sf::String::~String((String *)0x176edd);
  sf::Transformable::~Transformable((Transformable *)(in_RDI + 0x1f));
  Signal<gui::Widget_*>::~Signal((Signal<gui::Widget_*> *)0x176eff);
  Signal<gui::Widget_*>::~Signal((Signal<gui::Widget_*> *)0x176f10);
  Signal<gui::Widget_*>::~Signal((Signal<gui::Widget_*> *)0x176f1e);
  Signal<gui::Widget_*>::~Signal((Signal<gui::Widget_*> *)0x176f2c);
  sf::Drawable::~Drawable(in_RDI);
  std::enable_shared_from_this<gui::Widget>::~enable_shared_from_this
            ((enable_shared_from_this<gui::Widget> *)0x176f44);
  return;
}

Assistant:

virtual ~Widget() = default;